

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O3

int qt_gl_resolve_features(void)

{
  bool bVar1;
  int iVar2;
  OpenGLContextProfile OVar3;
  QOpenGLContext *this;
  Node<QByteArray,_QHashDummyValue> *pNVar4;
  pair<int,_int> pVar5;
  uint uVar6;
  uint uVar7;
  QByteArray *this_00;
  uint uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QSurfaceFormat format;
  QOpenGLExtensionMatcher extensions;
  QByteArray local_90;
  QByteArray local_78;
  QByteArray local_60;
  QByteArray local_48;
  Hash local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this = QOpenGLContext::currentContext();
  local_30.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLExtensionMatcher::QOpenGLExtensionMatcher((QOpenGLExtensionMatcher *)&local_30);
  QByteArray::QByteArray(&local_48,"GL_KHR_blend_equation_advanced",-1);
  if ((local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) ||
     (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_30.d,&local_48),
     pNVar4 == (Node<QByteArray,_QHashDummyValue> *)0x0)) {
    QByteArray::QByteArray(&local_60,"GL_NV_blend_equation_advanced",-1);
    if (local_30.d != (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_30.d,&local_60);
      bVar1 = true;
      if (pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055c037;
    }
    uVar8 = 0;
LAB_0055c0f1:
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    bVar1 = false;
LAB_0055c037:
    QByteArray::QByteArray(&local_78,"GL_KHR_blend_equation_advanced_coherent",-1);
    if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
LAB_0055c06b:
      QByteArray::QByteArray(&local_90,"GL_NV_blend_equation_advanced_coherent",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        uVar8 = 0;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_90);
        uVar8 = (uint)(pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0);
      }
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_30.d,&local_78);
      uVar8 = 1;
      if (pNVar4 == (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055c06b;
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar1) goto LAB_0055c0f1;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  uVar8 = uVar8 << 0x11;
  bVar1 = QOpenGLContext::isOpenGLES(this);
  if (bVar1) {
    QByteArray::QByteArray(&local_48,"GL_IMG_texture_npot",-1);
    if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      uVar6 = 0xfff;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_30.d,&local_48);
      uVar6 = (uint)(pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0) << 0xc | 0xfff;
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    QByteArray::QByteArray(&local_48,"GL_OES_texture_npot",-1);
    if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
      bVar1 = false;
    }
    else {
      pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
               findNode<QByteArray>(local_30.d,&local_48);
      bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (bVar1) {
      uVar6 = 0x3fff;
    }
    uVar6 = uVar6 | uVar8;
    QOpenGLContext::format((QOpenGLContext *)&local_78);
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_78);
    if (iVar2 < 3) {
      QByteArray::QByteArray(&local_48,"GL_EXT_texture_rg",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
      uVar7 = uVar6 | 0x8000;
      if (!bVar1) {
        uVar7 = uVar6;
      }
    }
    else {
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
      uVar7 = uVar6 | 0x8000;
    }
    QOpenGLContext::format((QOpenGLContext *)&local_48);
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_48);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_48);
    uVar8 = uVar7;
    if (iVar2 < 3) goto LAB_0055c87a;
    uVar8 = uVar7 | 0x10000;
    QOpenGLContext::format((QOpenGLContext *)&local_78);
    iVar2 = QSurfaceFormat::minorVersion((QSurfaceFormat *)&local_78);
    if (1 < iVar2) {
      QByteArray::QByteArray(&local_48,"GL_KHR_blend_equation_advanced_coherent",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_78);
      if (bVar1) {
        uVar8 = uVar7 | 0x30000;
      }
      goto LAB_0055c87a;
    }
    this_00 = &local_78;
  }
  else {
    local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QOpenGLContext::currentContext();
    QOpenGLContext::format((QOpenGLContext *)&local_90);
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_90);
    if (iVar2 < 3) {
      QByteArray::QByteArray(&local_48,"GL_EXT_framebuffer_object",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
LAB_0055c200:
        QByteArray::QByteArray(&local_78,"GL_ARB_framebuffer_object",-1);
        if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
          uVar6 = 0x8000;
        }
        else {
          pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                   findNode<QByteArray>(local_30.d,&local_78);
          uVar6 = 0x18008;
          if (pNVar4 == (Node<QByteArray,_QHashDummyValue> *)0x0) {
            uVar6 = 0x8000;
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        uVar6 = 0x18008;
        if (pNVar4 == (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055c200;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar6 | uVar8;
    }
    else {
      uVar8 = uVar8 | 0x18008;
    }
    iVar2 = QSurfaceFormat::majorVersion((QSurfaceFormat *)&local_90);
    if (iVar2 < 2) {
      QByteArray::QByteArray(&local_48,"GL_ARB_multitexture",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        uVar6 = 0;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        uVar6 = (uint)(pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      QByteArray::QByteArray(&local_48,"GL_ARB_shader_objects",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar7 = uVar6 | uVar8 | 2;
      if (!bVar1) {
        uVar7 = uVar6 | uVar8;
      }
      QByteArray::QByteArray(&local_48,"GL_EXT_blend_color",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar7 | 0x10;
      if (!bVar1) {
        uVar8 = uVar7;
      }
      QByteArray::QByteArray(&local_48,"GL_EXT_blend_equation_separate",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar6 = uVar8 | 0x40;
      if (!bVar1) {
        uVar6 = uVar8;
      }
      QByteArray::QByteArray(&local_48,"GL_EXT_blend_subtract",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar6 | 0x100;
      if (!bVar1) {
        uVar8 = uVar6;
      }
      QByteArray::QByteArray(&local_48,"GL_EXT_blend_func_separate",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar6 = uVar8 | 0x80;
      if (!bVar1) {
        uVar6 = uVar8;
      }
      QByteArray::QByteArray(&local_48,"GL_ARB_texture_compression",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar6 | 0x200;
      if (!bVar1) {
        uVar8 = uVar6;
      }
      QByteArray::QByteArray(&local_48,"GL_ARB_multisample",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar6 = uVar8 | 0x400;
      if (!bVar1) {
        uVar6 = uVar8;
      }
      QByteArray::QByteArray(&local_48,"GL_ARB_texture_non_power_of_two",-1);
      if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
        bVar1 = false;
      }
      else {
        pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                 findNode<QByteArray>(local_30.d,&local_48);
        bVar1 = pNVar4 != (Node<QByteArray,_QHashDummyValue> *)0x0;
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar6 | 0x3000;
      if (!bVar1) {
        uVar8 = uVar6;
      }
    }
    else {
      uVar8 = uVar8 | 0x3ff7;
    }
    pVar5 = QSurfaceFormat::version((QSurfaceFormat *)&local_90);
    if (pVar5.first < 3) goto LAB_0055c86a;
    if (pVar5.first == 3) {
      if (-1 < (long)pVar5) {
        if ((ulong)pVar5 >> 0x20 == 0) {
          bVar1 = QSurfaceFormat::testOption((QSurfaceFormat *)&local_90,DeprecatedFunctions);
          if (!bVar1) {
LAB_0055c929:
            bVar1 = false;
            goto LAB_0055c92c;
          }
        }
        else {
          if (pVar5.second != 1) goto LAB_0055c929;
          QByteArray::QByteArray(&local_48,"GL_ARB_compatibility",-1);
          if (local_30.d == (Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_> *)0x0) {
            bVar1 = true;
LAB_0055c92c:
            if (pVar5.second < 2) {
              if (!bVar1) goto LAB_0055c870;
              bVar9 = false;
            }
            else {
              OVar3 = QSurfaceFormat::profile((QSurfaceFormat *)&local_90);
              bVar9 = OVar3 == CompatibilityProfile;
              if (!bVar1) goto LAB_0055c865;
            }
          }
          else {
            pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QHashDummyValue>_>::
                     findNode<QByteArray>(local_30.d,&local_48);
            bVar9 = true;
            bVar1 = true;
            if (pNVar4 == (Node<QByteArray,_QHashDummyValue> *)0x0) goto LAB_0055c92c;
          }
          if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (!bVar9) goto LAB_0055c870;
        }
      }
LAB_0055c86a:
      uVar8 = uVar8 | 0x4000;
    }
    else {
      OVar3 = QSurfaceFormat::profile((QSurfaceFormat *)&local_90);
LAB_0055c865:
      if (OVar3 == CompatibilityProfile) goto LAB_0055c86a;
    }
LAB_0055c870:
    this_00 = &local_90;
  }
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)this_00);
LAB_0055c87a:
  QHash<QByteArray,_QHashDummyValue>::~QHash(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar8;
}

Assistant:

static int qt_gl_resolve_features()
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    QOpenGLExtensionMatcher extensions;
    int features = 0;
    if ((extensions.match("GL_KHR_blend_equation_advanced")
        || extensions.match("GL_NV_blend_equation_advanced")) &&
        (extensions.match("GL_KHR_blend_equation_advanced_coherent")
        || extensions.match("GL_NV_blend_equation_advanced_coherent"))) {
        // We need both the advanced equations and the coherency for us
        // to be able to easily use the new blend equations
        features |= QOpenGLFunctions::BlendEquationAdvanced;
    }
    if (ctx->isOpenGLES()) {
        // OpenGL ES
        features |= QOpenGLFunctions::Multitexture |
            QOpenGLFunctions::Shaders |
            QOpenGLFunctions::Buffers |
            QOpenGLFunctions::Framebuffers |
            QOpenGLFunctions::BlendColor |
            QOpenGLFunctions::BlendEquation |
            QOpenGLFunctions::BlendEquationSeparate |
            QOpenGLFunctions::BlendFuncSeparate |
            QOpenGLFunctions::BlendSubtract |
            QOpenGLFunctions::CompressedTextures |
            QOpenGLFunctions::Multisample |
            QOpenGLFunctions::StencilSeparate;
        if (extensions.match("GL_IMG_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures;
        if (extensions.match("GL_OES_texture_npot"))
            features |= QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        if (ctx->format().majorVersion() >= 3 || extensions.match("GL_EXT_texture_rg"))
            features |= QOpenGLFunctions::TextureRGFormats;
        if (ctx->format().majorVersion() >= 3) {
            features |= QOpenGLFunctions::MultipleRenderTargets;
            if (ctx->format().minorVersion() >= 2 && extensions.match("GL_KHR_blend_equation_advanced_coherent")) {
                // GL_KHR_blend_equation_advanced is included in OpenGL ES/3.2
                features |= QOpenGLFunctions::BlendEquationAdvanced;
            }
        }
        return features;
    } else {
        // OpenGL
        features |= QOpenGLFunctions::TextureRGFormats;
        QSurfaceFormat format = QOpenGLContext::currentContext()->format();

        if (format.majorVersion() >= 3)
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;
        else if (extensions.match("GL_EXT_framebuffer_object") || extensions.match("GL_ARB_framebuffer_object"))
            features |= QOpenGLFunctions::Framebuffers | QOpenGLFunctions::MultipleRenderTargets;

        if (format.majorVersion() >= 2) {
            features |= QOpenGLFunctions::BlendColor |
                QOpenGLFunctions::BlendEquation |
                QOpenGLFunctions::BlendSubtract |
                QOpenGLFunctions::Multitexture |
                QOpenGLFunctions::CompressedTextures |
                QOpenGLFunctions::Multisample |
                QOpenGLFunctions::BlendFuncSeparate |
                QOpenGLFunctions::Buffers |
                QOpenGLFunctions::Shaders |
                QOpenGLFunctions::StencilSeparate |
                QOpenGLFunctions::BlendEquationSeparate |
                QOpenGLFunctions::NPOTTextures |
                QOpenGLFunctions::NPOTTextureRepeat;
        } else {
            // Recognize features by extension name.
            if (extensions.match("GL_ARB_multitexture"))
                features |= QOpenGLFunctions::Multitexture;
            if (extensions.match("GL_ARB_shader_objects"))
                features |= QOpenGLFunctions::Shaders;
            if (extensions.match("GL_EXT_blend_color"))
                features |= QOpenGLFunctions::BlendColor;
            if (extensions.match("GL_EXT_blend_equation_separate"))
                features |= QOpenGLFunctions::BlendEquationSeparate;
            if (extensions.match("GL_EXT_blend_subtract"))
                features |= QOpenGLFunctions::BlendSubtract;
            if (extensions.match("GL_EXT_blend_func_separate"))
                features |= QOpenGLFunctions::BlendFuncSeparate;
            if (extensions.match("GL_ARB_texture_compression"))
                features |= QOpenGLFunctions::CompressedTextures;
            if (extensions.match("GL_ARB_multisample"))
                features |= QOpenGLFunctions::Multisample;
            if (extensions.match("GL_ARB_texture_non_power_of_two"))
                features |= QOpenGLFunctions::NPOTTextures |
                    QOpenGLFunctions::NPOTTextureRepeat;
        }

        const std::pair<int, int> version = format.version();
        if (version < std::pair(3, 0)
            || (version == std::pair(3, 0) && format.testOption(QSurfaceFormat::DeprecatedFunctions))
            || (version == std::pair(3, 1) && extensions.match("GL_ARB_compatibility"))
            || (version >= std::pair(3, 2) && format.profile() == QSurfaceFormat::CompatibilityProfile)) {
            features |= QOpenGLFunctions::FixedFunctionPipeline;
        }
        return features;
    }
}